

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

void __thiscall QString::clear(QString *this)

{
  char16_t *pcVar1;
  char16_t *tmp;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->d).ptr;
  if (pcVar1 != (char16_t *)0x0) {
    local_20.d = (this->d).d;
    (this->d).d = (Data *)0x0;
    (this->d).ptr = (char16_t *)0x0;
    local_20.size = (this->d).size;
    (this->d).size = 0;
    local_20.ptr = pcVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QString::clear()
{ if (!isNull()) *this = QString(); }